

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

bool test_encode_int_custom_size(char *buf,int64_t val,int size)

{
  byte val_00;
  char *pcVar1;
  char *pos;
  int size_local;
  int64_t val_local;
  char *buf_local;
  
  val_00 = (byte)val;
  switch(size) {
  case 1:
    if ((val < 0x80) && (-0x21 < val)) {
      if (val < 0) {
        mp_store_u8(buf,val_00 | 0xe0);
      }
      else {
        mp_store_u8(buf,val_00);
      }
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
    break;
  case 2:
    if ((val < -0x80) || (0x7f < val)) {
      buf_local._7_1_ = false;
    }
    else {
      pcVar1 = mp_store_u8(buf,0xd0);
      mp_store_u8(pcVar1,val_00);
      buf_local._7_1_ = true;
    }
    break;
  case 3:
    if ((val < -0x8000) || (0x7fff < val)) {
      buf_local._7_1_ = false;
    }
    else {
      pcVar1 = mp_store_u8(buf,0xd1);
      mp_store_u16(pcVar1,(uint16_t)val);
      buf_local._7_1_ = true;
    }
    break;
  default:
    abort();
  case 5:
    if ((val < -0x80000000) || (0x7fffffff < val)) {
      buf_local._7_1_ = false;
    }
    else {
      pcVar1 = mp_store_u8(buf,0xd2);
      mp_store_u32(pcVar1,(uint32_t)val);
      buf_local._7_1_ = true;
    }
    break;
  case 9:
    pcVar1 = mp_store_u8(buf,0xd3);
    mp_store_u64(pcVar1,val);
    buf_local._7_1_ = true;
  }
  return buf_local._7_1_;
}

Assistant:

MP_IMPL int
mp_read_double_impl(const char **data, double *ret, bool may_lose_precision)
{
	int64_t ival;
	uint64_t uval;
	double val;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t) mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t) mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t) mp_load_u32(&p);
		break;
	case 0xd3:
		ival = (int64_t) mp_load_u64(&p);
		val = (double) ival;
		if (!may_lose_precision && (int64_t)val != ival)
			return -1;
		*ret = val;
		break;
	case 0xcc:
		*ret = mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = mp_load_u16(&p);
		break;
	case 0xce:
		*ret = mp_load_u32(&p);
		break;
	case 0xcf:
		uval = mp_load_u64(&p);
		val = (double)uval;
		if (!may_lose_precision && (uint64_t)val != uval)
			return -1;
		*ret = val;
		break;
	case 0xca:
		*ret = mp_load_float(&p);
		break;
	case 0xcb:
		*ret = mp_load_double(&p);
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}